

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

Uint32 GPU_LinkManyShaders(Uint32 *shader_objects,int count)

{
  _Bool _Var1;
  Uint32 UVar2;
  ulong uVar3;
  ulong uVar4;
  
  UVar2 = 0;
  if (((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
      (UVar2 = 0, _gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) &&
     ((~_gpu_current_renderer->enabled_features & 0x300) == 0)) {
    UVar2 = (*_gpu_current_renderer->impl->CreateShaderProgram)(_gpu_current_renderer);
    uVar3 = 0;
    uVar4 = (ulong)(uint)count;
    if (count < 1) {
      uVar4 = uVar3;
    }
    while( true ) {
      if (uVar4 == uVar3) break;
      (*_gpu_current_renderer->impl->AttachShader)
                (_gpu_current_renderer,UVar2,shader_objects[uVar3]);
      uVar3 = uVar3 + 1;
    }
    _Var1 = (*_gpu_current_renderer->impl->LinkShaderProgram)(_gpu_current_renderer,UVar2);
    if (!_Var1) {
      (*_gpu_current_renderer->impl->FreeShaderProgram)(_gpu_current_renderer,UVar2);
      UVar2 = 0;
    }
  }
  return UVar2;
}

Assistant:

Uint32 GPU_LinkManyShaders(Uint32 *shader_objects, int count)
{
    Uint32 p;
    int i;

    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return 0;

    if((_gpu_current_renderer->enabled_features & GPU_FEATURE_BASIC_SHADERS) != GPU_FEATURE_BASIC_SHADERS)
        return 0;

    p = _gpu_current_renderer->impl->CreateShaderProgram(_gpu_current_renderer);

    for (i = 0; i < count; i++)
        _gpu_current_renderer->impl->AttachShader(_gpu_current_renderer, p, shader_objects[i]);

    if(_gpu_current_renderer->impl->LinkShaderProgram(_gpu_current_renderer, p))
        return p;

    _gpu_current_renderer->impl->FreeShaderProgram(_gpu_current_renderer, p);
    return 0;
}